

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *p_data,float v_speed,void *p_min,
                      void *p_max,char *format,ImGuiSliderFlags flags)

{
  float fVar1;
  ImVec2 p_min_00;
  ImVec2 p_max_00;
  ImGuiContext *pIVar2;
  char *text_end;
  bool bVar3;
  ImGuiID id_00;
  int iVar4;
  ImU32 fill_col;
  ImGuiWindow *this;
  ImGuiDataTypeInfo *pIVar5;
  bool bVar6;
  bool bVar7;
  float _x;
  ImGuiCol local_1b4;
  void *local_1b0;
  void *local_1a0;
  byte local_16c;
  byte local_16b;
  bool local_169;
  float local_15c;
  ImVec2 local_130;
  ImVec2 local_128;
  char *local_120;
  char *value_buf_end;
  char value_buf [64];
  bool value_changed;
  ImU32 frame_col;
  bool is_clamp_input;
  bool double_clicked;
  bool clicked;
  bool focus_requested;
  bool temp_input_is_active;
  bool hovered;
  bool temp_input_allowed;
  ImVec2 local_a8;
  undefined1 local_a0 [8];
  ImRect total_bb;
  ImVec2 local_88;
  undefined1 local_80 [8];
  ImRect frame_bb;
  ImVec2 label_size;
  float w;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *format_local;
  void *p_max_local;
  void *p_min_local;
  float v_speed_local;
  void *p_data_local;
  ImGuiDataType data_type_local;
  char *label_local;
  
  this = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this,label,(char *)0x0);
    _x = CalcItemWidth();
    frame_bb.Max = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar1 = (pIVar2->Style).FramePadding.y;
    ImVec2::ImVec2(&total_bb.Max,_x,fVar1 + fVar1 + frame_bb.Max.y);
    local_88 = ::operator+(&(this->DC).CursorPos,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_80,&(this->DC).CursorPos,&local_88);
    if (frame_bb.Max.x <= 0.0) {
      local_15c = 0.0;
    }
    else {
      local_15c = (pIVar2->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff50,local_15c,0.0);
    local_a8 = ::operator+(&frame_bb.Min,(ImVec2 *)&stack0xffffffffffffff50);
    ImRect::ImRect((ImRect *)local_a0,(ImVec2 *)local_80,&local_a8);
    bVar6 = (flags & 0x80U) == 0;
    ItemSize((ImRect *)local_a0,(pIVar2->Style).FramePadding.y);
    bVar3 = ItemAdd((ImRect *)local_a0,id_00,(ImRect *)local_80,(uint)bVar6);
    if (bVar3) {
      if (format == (char *)0x0) {
        pIVar5 = DataTypeGetInfo(data_type);
        window = (ImGuiWindow *)pIVar5->PrintFmt;
      }
      else {
        window = (ImGuiWindow *)format;
        if ((data_type == 4) && (iVar4 = strcmp(format,"%d"), iVar4 != 0)) {
          window = (ImGuiWindow *)PatchFormatStringFloatToInt(format);
        }
      }
      bVar3 = ItemHoverable((ImRect *)local_80,id_00);
      local_169 = false;
      if (bVar6) {
        local_169 = TempInputIsActive(id_00);
      }
      frame_col._1_1_ = local_169;
      if (local_169 == false) {
        bVar7 = false;
        if (bVar6) {
          bVar7 = ((this->DC).LastItemStatusFlags & 0x300U) != 0;
        }
        local_16b = 0;
        if (bVar3) {
          local_16b = (pIVar2->IO).MouseClicked[0];
        }
        local_16c = 0;
        if (bVar3) {
          local_16c = (pIVar2->IO).MouseDoubleClicked[0];
        }
        if ((((bVar7) || ((local_16b & 1) != 0)) || ((local_16c & 1) != 0)) ||
           ((pIVar2->NavActivateId == id_00 || (pIVar2->NavInputId == id_00)))) {
          SetActiveID(id_00,this);
          SetFocusID(id_00,this);
          FocusWindow(this);
          pIVar2->ActiveIdUsingNavDirMask = 3;
          if ((bVar6) &&
             ((((bVar7 || (((local_16b & 1) != 0 && (((pIVar2->IO).KeyCtrl & 1U) != 0)))) ||
               ((local_16c & 1) != 0)) || (pIVar2->NavInputId == id_00)))) {
            frame_col._1_1_ = true;
          }
        }
        if ((((((pIVar2->IO).ConfigDragClickToInputText & 1U) != 0) && (bVar6)) &&
            (frame_col._1_1_ == false)) &&
           (((pIVar2->ActiveId == id_00 && (bVar3)) &&
            ((((pIVar2->IO).MouseReleased[0] & 1U) != 0 &&
             (bVar3 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5), !bVar3)))))
           ) {
          pIVar2->NavInputId = id_00;
          frame_col._1_1_ = true;
        }
      }
      if (frame_col._1_1_ == false) {
        if (pIVar2->ActiveId == id_00) {
          local_1b4 = 9;
        }
        else {
          local_1b4 = 7;
          if (pIVar2->HoveredId == id_00) {
            local_1b4 = 8;
          }
        }
        fill_col = GetColorU32(local_1b4,1.0);
        RenderNavHighlight((ImRect *)local_80,id_00,1);
        p_min_00.y = (float)local_80._4_4_;
        p_min_00.x = (float)local_80._0_4_;
        p_max_00.y = frame_bb.Min.y;
        p_max_00.x = frame_bb.Min.x;
        RenderFrame(p_min_00,p_max_00,fill_col,true,(pIVar2->Style).FrameRounding);
        value_buf[0x3f] =
             DragBehavior(id_00,data_type,p_data,v_speed,p_min,p_max,(char *)window,flags);
        if ((bool)value_buf[0x3f]) {
          MarkItemEdited(id_00);
        }
        iVar4 = DataTypeFormatString((char *)&value_buf_end,0x40,data_type,p_data,(char *)window);
        local_120 = value_buf + (long)iVar4 + -8;
        if ((pIVar2->LogEnabled & 1U) != 0) {
          LogSetNextTextDecoration("{","}");
        }
        text_end = local_120;
        ImVec2::ImVec2(&local_128,0.5,0.5);
        RenderTextClipped((ImVec2 *)local_80,&frame_bb.Min,(char *)&value_buf_end,text_end,
                          (ImVec2 *)0x0,&local_128,(ImRect *)0x0);
        if (0.0 < frame_bb.Max.x) {
          ImVec2::ImVec2(&local_130,frame_bb.Min.x + (pIVar2->Style).ItemInnerSpacing.x,
                         (float)local_80._4_4_ + (pIVar2->Style).FramePadding.y);
          RenderText(local_130,label,(char *)0x0,true);
        }
        label_local._7_1_ = (bool)(value_buf[0x3f] & 1);
      }
      else {
        bVar3 = false;
        if ((((flags & 0x10U) != 0) && (bVar3 = true, p_min != (void *)0x0)) &&
           (bVar3 = true, p_max != (void *)0x0)) {
          iVar4 = DataTypeCompare(data_type,p_min,p_max);
          bVar3 = iVar4 < 0;
        }
        local_1b0 = p_max;
        local_1a0 = p_min;
        if (!bVar3) {
          local_1a0 = (void *)0x0;
          local_1b0 = (void *)0x0;
        }
        label_local._7_1_ =
             TempInputScalar((ImRect *)local_80,id_00,label,data_type,p_data,(char *)window,
                             local_1a0,local_1b0);
      }
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::DragScalar(const char* label, ImGuiDataType data_type, void* p_data, float v_speed, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const float w = CalcItemWidth();

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    const bool temp_input_allowed = (flags & ImGuiSliderFlags_NoInput) == 0;
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb, temp_input_allowed ? ImGuiItemAddFlags_Focusable : 0))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    // Tabbing or CTRL-clicking on Drag turns it into an InputText
    const bool hovered = ItemHoverable(frame_bb, id);
    bool temp_input_is_active = temp_input_allowed && TempInputIsActive(id);
    if (!temp_input_is_active)
    {
        const bool focus_requested = temp_input_allowed && (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_Focused) != 0;
        const bool clicked = (hovered && g.IO.MouseClicked[0]);
        const bool double_clicked = (hovered && g.IO.MouseDoubleClicked[0]);
        if (focus_requested || clicked || double_clicked || g.NavActivateId == id || g.NavInputId == id)
        {
            SetActiveID(id, window);
            SetFocusID(id, window);
            FocusWindow(window);
            g.ActiveIdUsingNavDirMask = (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right);
            if (temp_input_allowed && (focus_requested || (clicked && g.IO.KeyCtrl) || double_clicked || g.NavInputId == id))
                temp_input_is_active = true;
        }
        // Experimental: simple click (without moving) turns Drag into an InputText
        // FIXME: Currently polling ImGuiConfigFlags_IsTouchScreen, may either poll an hypothetical ImGuiBackendFlags_HasKeyboard and/or an explicit drag settings.
        if (g.IO.ConfigDragClickToInputText && temp_input_allowed && !temp_input_is_active)
            if (g.ActiveId == id && hovered && g.IO.MouseReleased[0] && !IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
            {
                g.NavInputId = id;
                temp_input_is_active = true;
            }
    }

    if (temp_input_is_active)
    {
        // Only clamp CTRL+Click input when ImGuiSliderFlags_AlwaysClamp is set
        const bool is_clamp_input = (flags & ImGuiSliderFlags_AlwaysClamp) != 0 && (p_min == NULL || p_max == NULL || DataTypeCompare(data_type, p_min, p_max) < 0);
        return TempInputScalar(frame_bb, id, label, data_type, p_data, format, is_clamp_input ? p_min : NULL, is_clamp_input ? p_max : NULL);
    }

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, style.FrameRounding);

    // Drag behavior
    const bool value_changed = DragBehavior(id, data_type, p_data, v_speed, p_min, p_max, format, flags);
    if (value_changed)
        MarkItemEdited(id);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    if (g.LogEnabled)
        LogSetNextTextDecoration("{", "}");
    RenderTextClipped(frame_bb.Min, frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.5f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    return value_changed;
}